

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int resolveCompoundOrderBy(Parse *pParse,Select *pSelect)

{
  byte *pbVar1;
  u8 uVar2;
  sqlite3 *psVar3;
  Expr *pEVar4;
  Expr **ppEVar5;
  Select *pSVar6;
  Select *pSVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  Expr *pEVar11;
  long lVar12;
  ExprList_item *pEVar13;
  long lVar14;
  Expr *pE;
  Expr *pEVar15;
  ulong uVar16;
  int iVar17;
  ExprList *pEVar18;
  ulong uVar19;
  ExprList_item *pEVar20;
  Expr *p;
  int iCol;
  int local_ac;
  Expr *local_a8;
  sqlite3 *local_a0;
  int local_94;
  ExprList_item *local_90;
  ExprList *local_88;
  Parse *local_80;
  Parse *local_78;
  long local_70;
  NameContext local_68;
  
  pEVar18 = pSelect->pOrderBy;
  if (pEVar18 == (ExprList *)0x0) {
    return 0;
  }
  local_a0 = pParse->db;
  uVar10 = pEVar18->nExpr;
  uVar19 = (ulong)uVar10;
  if (local_a0->aLimit[2] < (int)uVar10) {
    sqlite3ErrorMsg(pParse,"too many terms in ORDER BY clause");
  }
  else {
    if (0 < (int)uVar10) {
      lVar12 = 0x19;
      lVar14 = 0;
      do {
        pbVar1 = (byte *)((long)&pEVar18->a->pExpr + lVar12);
        *pbVar1 = *pbVar1 & 0xfe;
        lVar14 = lVar14 + 1;
        uVar19 = (ulong)pEVar18->nExpr;
        lVar12 = lVar12 + 0x20;
      } while (lVar14 < (long)uVar19);
    }
    pSelect->pNext = (Select *)0x0;
    pSVar7 = pSelect->pPrior;
    while (pSVar6 = pSVar7, local_88 = pEVar18, local_78 = pParse, pSVar6 != (Select *)0x0) {
      pSVar6->pNext = pSelect;
      pSelect = pSVar6;
      pSVar7 = pSVar6->pPrior;
    }
    do {
      if ((int)uVar19 < 1) {
        return 0;
      }
      local_80 = (Parse *)pSelect->pEList;
      pEVar20 = pEVar18->a;
      iVar17 = 0;
      local_94 = 0;
      do {
        local_ac = -1;
        if ((pEVar20->field_0x19 & 1) == 0) {
          p = pEVar20->pExpr;
          while (p != (Expr *)0x0) {
            if ((p->flags >> 0xc & 1) == 0) goto LAB_0015b186;
            if ((p->flags >> 0x12 & 1) == 0) {
              pEVar13 = (ExprList_item *)&p->pLeft;
            }
            else {
              pEVar13 = ((p->x).pList)->a;
            }
            p = pEVar13->pExpr;
          }
          p = (Expr *)0x0;
LAB_0015b186:
          iVar8 = sqlite3ExprIsInteger(p,&local_ac);
          if (iVar8 == 0) {
            local_ac = resolveAsName(local_80,(ExprList *)p,pE);
            psVar3 = local_a0;
            if (local_ac == 0) {
              if (p == (Expr *)0x0) {
                pEVar11 = (Expr *)0x0;
              }
              else {
                pEVar11 = exprDup(local_a0,p,0,(u8 **)0x0);
              }
              iVar8 = local_ac;
              if (psVar3->mallocFailed == '\0') {
                local_90 = (ExprList_item *)pSelect->pEList;
                local_68.pSrcList = pSelect->pSrc;
                local_68.nRef = 0;
                local_68.nErr = 0;
                local_68.pAggInfo = (AggInfo *)0x0;
                local_68.pNext = (NameContext *)0x0;
                local_68.ncFlags = 1;
                local_68._50_6_ = 0;
                psVar3 = pParse->db;
                uVar2 = psVar3->suppressErr;
                psVar3->suppressErr = '\x01';
                local_a8 = pEVar11;
                local_68.pParse = pParse;
                local_68.pEList = (ExprList *)local_90;
                iVar9 = sqlite3ResolveExprNames(&local_68,pEVar11);
                psVar3->suppressErr = uVar2;
                pEVar11 = local_a8;
                pParse = local_78;
                iVar8 = 0;
                if ((iVar9 == 0) &&
                   (ppEVar5 = &local_90->pExpr, iVar8 = 0, 0 < (long)*(int *)ppEVar5)) {
                  local_90 = (ExprList_item *)local_90->zName;
                  local_70 = (long)*(int *)ppEVar5 << 5;
                  iVar8 = 1;
                  lVar12 = 0;
                  do {
                    uVar10 = sqlite3ExprCompare(*(Expr **)((long)&local_90->pExpr + lVar12),local_a8
                                                ,-1);
                    pEVar11 = local_a8;
                    pParse = local_78;
                    if (uVar10 < 2) goto LAB_0015b274;
                    iVar8 = iVar8 + 1;
                    lVar12 = lVar12 + 0x20;
                  } while (local_70 != lVar12);
                  iVar8 = 0;
                }
              }
LAB_0015b274:
              local_ac = iVar8;
              if (pEVar11 != (Expr *)0x0) {
                sqlite3ExprDeleteNN(local_a0,pEVar11);
              }
            }
            if (local_ac < 1) {
              local_94 = 1;
              pEVar18 = local_88;
              goto LAB_0015b30d;
            }
          }
          else if ((local_ac < 1) || (*(int *)&local_80->db < local_ac)) {
            sqlite3ErrorMsg(pParse,"%r %s BY term out of range - should be between 1 and %d",
                            (ulong)(iVar17 + 1),"ORDER");
            return 1;
          }
          iVar8 = local_ac;
          local_68.pParse = (Parse *)0x0;
          local_68.pSrcList = (SrcList *)((ulong)local_68.pSrcList & 0xffffffff00000000);
          pEVar11 = sqlite3ExprAlloc(local_a0,0x86,(Token *)&local_68,0);
          if (pEVar11 == (Expr *)0x0) {
            return 1;
          }
          pbVar1 = (byte *)((long)&pEVar11->flags + 1);
          *pbVar1 = *pbVar1 | 4;
          (pEVar11->u).iValue = iVar8;
          pEVar13 = pEVar20;
          pEVar4 = pEVar20->pExpr;
          if (pEVar20->pExpr != p) {
            do {
              pEVar15 = pEVar4;
              pEVar4 = pEVar15->pLeft;
            } while (pEVar4->op == '5');
            pEVar13 = (ExprList_item *)&pEVar15->pLeft;
          }
          pEVar13->pExpr = pEVar11;
          if (p != (Expr *)0x0) {
            sqlite3ExprDeleteNN(local_a0,p);
            iVar8 = local_ac;
          }
          (pEVar20->u).x.iOrderByCol = (u16)iVar8;
          pEVar20->field_0x19 = pEVar20->field_0x19 | 1;
          pEVar18 = local_88;
        }
LAB_0015b30d:
        iVar17 = iVar17 + 1;
        pEVar20 = pEVar20 + 1;
        uVar10 = pEVar18->nExpr;
        uVar19 = (ulong)uVar10;
      } while (iVar17 < (int)uVar10);
      pSelect = pSelect->pNext;
    } while ((pSelect != (Select *)0x0) && (local_94 != 0));
    if ((int)uVar10 < 1) {
      return 0;
    }
    uVar16 = 1;
    lVar12 = 0;
    while (((&pEVar18->a->field_0x19)[lVar12] & 1) != 0) {
      uVar16 = (ulong)((int)uVar16 + 1);
      lVar12 = lVar12 + 0x20;
      if (uVar19 << 5 == lVar12) {
        return 0;
      }
    }
    sqlite3ErrorMsg(pParse,"%r ORDER BY term does not match any column in the result set",uVar16);
  }
  return 1;
}

Assistant:

static int resolveCompoundOrderBy(
  Parse *pParse,        /* Parsing context.  Leave error messages here */
  Select *pSelect       /* The SELECT statement containing the ORDER BY */
){
  int i;
  ExprList *pOrderBy;
  ExprList *pEList;
  sqlite3 *db;
  int moreToDo = 1;

  pOrderBy = pSelect->pOrderBy;
  if( pOrderBy==0 ) return 0;
  db = pParse->db;
#if SQLITE_MAX_COLUMN
  if( pOrderBy->nExpr>db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many terms in ORDER BY clause");
    return 1;
  }
#endif
  for(i=0; i<pOrderBy->nExpr; i++){
    pOrderBy->a[i].done = 0;
  }
  pSelect->pNext = 0;
  while( pSelect->pPrior ){
    pSelect->pPrior->pNext = pSelect;
    pSelect = pSelect->pPrior;
  }
  while( pSelect && moreToDo ){
    struct ExprList_item *pItem;
    moreToDo = 0;
    pEList = pSelect->pEList;
    assert( pEList!=0 );
    for(i=0, pItem=pOrderBy->a; i<pOrderBy->nExpr; i++, pItem++){
      int iCol = -1;
      Expr *pE, *pDup;
      if( pItem->done ) continue;
      pE = sqlite3ExprSkipCollate(pItem->pExpr);
      if( sqlite3ExprIsInteger(pE, &iCol) ){
        if( iCol<=0 || iCol>pEList->nExpr ){
          resolveOutOfRangeError(pParse, "ORDER", i+1, pEList->nExpr);
          return 1;
        }
      }else{
        iCol = resolveAsName(pParse, pEList, pE);
        if( iCol==0 ){
          pDup = sqlite3ExprDup(db, pE, 0);
          if( !db->mallocFailed ){
            assert(pDup);
            iCol = resolveOrderByTermToExprList(pParse, pSelect, pDup);
          }
          sqlite3ExprDelete(db, pDup);
        }
      }
      if( iCol>0 ){
        /* Convert the ORDER BY term into an integer column number iCol,
        ** taking care to preserve the COLLATE clause if it exists */
        Expr *pNew = sqlite3Expr(db, TK_INTEGER, 0);
        if( pNew==0 ) return 1;
        pNew->flags |= EP_IntValue;
        pNew->u.iValue = iCol;
        if( pItem->pExpr==pE ){
          pItem->pExpr = pNew;
        }else{
          Expr *pParent = pItem->pExpr;
          assert( pParent->op==TK_COLLATE );
          while( pParent->pLeft->op==TK_COLLATE ) pParent = pParent->pLeft;
          assert( pParent->pLeft==pE );
          pParent->pLeft = pNew;
        }
        sqlite3ExprDelete(db, pE);
        pItem->u.x.iOrderByCol = (u16)iCol;
        pItem->done = 1;
      }else{
        moreToDo = 1;
      }
    }
    pSelect = pSelect->pNext;
  }
  for(i=0; i<pOrderBy->nExpr; i++){
    if( pOrderBy->a[i].done==0 ){
      sqlite3ErrorMsg(pParse, "%r ORDER BY term does not match any "
            "column in the result set", i+1);
      return 1;
    }
  }
  return 0;
}